

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disasm.cpp
# Opt level: O0

Section * __thiscall
Disasm::disasmUntilJump
          (Section *__return_storage_ptr__,Disasm *this,ROMAddress *start,uint maxInstructions)

{
  byte bVar1;
  bool bVar2;
  uint8_t *data;
  Instruction local_39;
  undefined1 auStack_34 [3];
  Instruction inst;
  uint i;
  ROMAddress *pos;
  uint maxInstructions_local;
  ROMAddress *start_local;
  Disasm *this_local;
  Section *section;
  
  Section::Section(__return_storage_ptr__);
  __return_storage_ptr__->start = start;
  unique0x100000da = start;
  for (_auStack_34 = 0; _auStack_34 < maxInstructions; _auStack_34 = _auStack_34 + 1) {
    data = SNESROM::operator[](&this->m_ROM,stack0xffffffffffffffd0);
    Instruction::Instruction(&local_39,&this->m_State,data);
    std::vector<Instruction,_std::allocator<Instruction>_>::push_back
              (&__return_storage_ptr__->instructions,&local_39);
    bVar1 = Instruction::size(&local_39);
    ROMAddress::operator+=(stack0xffffffffffffffd0,(uint)bVar1);
    bVar2 = Instruction::isJump(&local_39);
    if (bVar2) break;
  }
  __return_storage_ptr__->end = stack0xffffffffffffffd0;
  return __return_storage_ptr__;
}

Assistant:

Disasm::Section Disasm::disasmUntilJump(ROMAddress* start, unsigned int maxInstructions) const {
    Section section;
    section.start = start;
    ROMAddress* pos = start;

    for(unsigned int i = 0; i < maxInstructions; ++i) {
        Instruction inst(m_State, m_ROM[pos]);
        section.instructions.push_back(inst);
        (*pos) += inst.size();

        if(inst.isJump()) {
            break;
        }
    }

    section.end = pos;

    return section;
}